

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall
CTPNSym::gen_code_member
          (CTPNSym *this,int discard,CTcPrsNode *prop_expr,int prop_is_expr,int argc,int varargs,
          CTcNamedArgs *named_args)

{
  CTcPrsSymtab *sym;
  CTcPrsSymtab *this_00;
  CTcSymbol *pCVar1;
  uint in_ECX;
  undefined8 in_RDX;
  uint in_ESI;
  long *in_RDI;
  uint in_R8D;
  uint in_R9D;
  undefined8 in_stack_00000008;
  undefined8 in_stack_ffffffffffffffb8;
  int copy_str;
  
  copy_str = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  sym = CTcCodeStream::get_symtab(G_cs);
  this_00 = (CTcPrsSymtab *)(**(code **)(*in_RDI + 0x60))();
  (**(code **)(*in_RDI + 0x68))();
  pCVar1 = CTcPrsSymtab::find_or_def_undef(this_00,(char *)sym,(size_t)in_RDI,copy_str);
  (*(pCVar1->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[0x1e])
            (pCVar1,(ulong)in_ESI,in_RDX,(ulong)in_ECX,(ulong)in_R8D,(ulong)in_R9D,in_stack_00000008
            );
  return;
}

Assistant:

void CTPNSym::gen_code_member(int discard, CTcPrsNode *prop_expr,
                              int prop_is_expr,
                              int argc, int varargs, CTcNamedArgs *named_args)
{
    /* 
     *   Look up the symbol, and let it do the work.  There's no
     *   appropriate default for the symbol, so leave it undefined if we
     *   can't find it. 
     */
    G_cs->get_symtab()
        ->find_or_def_undef(get_sym_text(), get_sym_text_len(), FALSE)
        ->gen_code_member(discard, prop_expr, prop_is_expr,
                          argc, varargs, named_args);
}